

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall embree::Scene::printStatistics(Scene *this)

{
  pointer puVar1;
  uint uVar2;
  Geometry *pGVar3;
  size_t i_1;
  ulong uVar4;
  ostream *poVar5;
  size_t i;
  size_t sVar6;
  size_type __new_size;
  size_t p;
  size_t t_1;
  size_t t;
  long lVar7;
  size_type sVar8;
  bool bVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> statistics [32];
  allocator local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_338 [32];
  
  __new_size = 0;
  for (sVar6 = 0; (this->geometries).size_active != sVar6; sVar6 = sVar6 + 1) {
    pGVar3 = (this->geometries).items[sVar6].ptr;
    if ((pGVar3 != (Geometry *)0x0) && (uVar2 = pGVar3->numTimeSteps, (uint)__new_size <= uVar2)) {
      __new_size = (ulong)uVar2;
    }
  }
  memset(local_338,0,0x300);
  for (lVar7 = 0; lVar7 != 0x300; lVar7 = lVar7 + 0x18) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_338[0]._M_impl.super__Vector_impl_data._M_start + lVar7),__new_size);
  }
  for (uVar4 = 0; uVar4 < (this->geometries).size_active; uVar4 = uVar4 + 1) {
    pGVar3 = (this->geometries).items[uVar4].ptr;
    if (pGVar3 != (Geometry *)0x0) {
      puVar1 = local_338[*(byte *)&pGVar3->field_8]._M_impl.super__Vector_impl_data._M_start +
               (int)(pGVar3->numTimeSteps - 1);
      *puVar1 = *puVar1 + (ulong)pGVar3->numPrimitives;
    }
  }
  *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 0x17;
  poVar5 = std::operator<<((ostream *)&std::cout,"segments");
  std::operator<<(poVar5,": ");
  for (sVar8 = 0; __new_size != sVar8; sVar8 = sVar8 + 1) {
    *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 10;
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"-------------------------");
  sVar8 = __new_size;
  while (bVar9 = sVar8 != 0, sVar8 = sVar8 - 1, bVar9) {
    std::operator<<((ostream *)&std::cout,"----------");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    std::__cxx11::string::string((string *)&local_358,(&Geometry::gtype_names)[lVar7],&local_359);
    bVar9 = std::operator==(&local_358,"");
    std::__cxx11::string::~string((string *)&local_358);
    if (!bVar9) {
      *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 0x17;
      poVar5 = std::operator<<((ostream *)&std::cout,(&Geometry::gtype_names)[lVar7]);
      std::operator<<(poVar5,": ");
      for (sVar8 = 0; __new_size != sVar8; sVar8 = sVar8 + 1) {
        *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 10;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  lVar7 = 0x2e8;
  do {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_338[0]._M_impl.super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  return;
}

Assistant:

void Scene::printStatistics()
  {
    /* calculate maximum number of time segments */
    unsigned max_time_steps = 0;
    for (size_t i=0; i<size(); i++) {
      if (!get(i)) continue;
      max_time_steps = max(max_time_steps,get(i)->numTimeSteps);
    }

    /* initialize vectors*/
    std::vector<size_t> statistics[Geometry::GTY_END];
    for (size_t i=0; i<Geometry::GTY_END; i++)
      statistics[i].resize(max_time_steps);

    /* gather statistics */
    for (size_t i=0; i<size(); i++) 
    {
      if (!get(i)) continue;
      int ty = get(i)->getType(); 
      assert(ty<Geometry::GTY_END);
      int timesegments = get(i)->numTimeSegments(); 
      assert((unsigned int)timesegments < max_time_steps);
      statistics[ty][timesegments] += get(i)->size();
    }

    /* print statistics */
    std::cout << std::setw(23) << "segments" << ": ";
    for (size_t t=0; t<max_time_steps; t++)
      std::cout << std::setw(10) << t;
    std::cout << std::endl;

    std::cout << "-------------------------";
    for (size_t t=0; t<max_time_steps; t++)
      std::cout << "----------";
    std::cout << std::endl;
    
    for (size_t p=0; p<Geometry::GTY_END; p++)
    {
      if (std::string(Geometry::gtype_names[p]) == "") continue;
      std::cout << std::setw(23) << Geometry::gtype_names[p] << ": ";
      for (size_t t=0; t<max_time_steps; t++)
        std::cout << std::setw(10) << statistics[p][t];
      std::cout << std::endl;
    }
  }